

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::Configure(cmMakefile *this)

{
  cmListFileBacktrace *value;
  element_type *peVar1;
  cmake *this_00;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  string *psVar5;
  cmListFileFunction *func;
  pointer pcVar6;
  cmListFileFunction *func_1;
  cmListFileFunction *func_2;
  pointer pcVar7;
  long lVar8;
  pointer ppcVar9;
  string_view value_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  initializer_list<cmListFileArgument> __l;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  allocator<char> local_231;
  cmListFileFunction project;
  allocator_type local_20b;
  allocator<char> local_20a;
  allocator<char> local_209;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> subdirs;
  cmListFile listFile;
  string currentStart;
  undefined1 *local_170;
  undefined8 local_168;
  undefined1 local_160 [16];
  pointer local_150;
  pointer local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_130;
  string local_118;
  string filesDir;
  BuildsystemFileScope scope;
  cmListFileContext local_a0;
  
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentSource_abi_cxx11_((cmStateDirectory *)&subdirs);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[16]>
            (&currentStart,psVar5,(char (*) [16])"/CMakeLists.txt");
  cmListFileContext::FromListFilePath(&local_a0,&currentStart);
  value = &this->Backtrace;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
            ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&subdirs,
             (cmListFileContext *)value);
  std::
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ::operator=((__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               *)value,(__shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                        *)&subdirs);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  cmListFileContext::~cmListFileContext(&local_a0);
  BuildsystemFileScope::BuildsystemFileScope(&scope,this);
  cmStateSnapshot::GetDirectory((cmStateDirectory *)&subdirs,&this->StateSnapshot);
  psVar5 = cmStateDirectory::GetCurrentBinary_abi_cxx11_((cmStateDirectory *)&subdirs);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[12]>
            (&filesDir,psVar5,(char (*) [12])"/CMakeFiles");
  cmsys::SystemTools::MakeDirectory(&filesDir,(mode_t *)0x0);
  bVar4 = cmsys::SystemTools::FileExists(&currentStart,true);
  if (!bVar4) {
    __assert_fail("cmSystemTools::FileExists(currentStart, true)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmMakefile.cxx"
                  ,0x6d6,"void cmMakefile::Configure()");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,"CMAKE_PARENT_LIST_FILE",(allocator<char> *)&project);
  value_00._M_str = currentStart._M_dataplus._M_p;
  value_00._M_len = currentStart._M_string_length;
  AddDefinition(this,(string *)&subdirs,value_00);
  std::__cxx11::string::~string((string *)&subdirs);
  std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs,
             &(this->GlobalGenerator->CMakeInstance->DebugAdapter).
              super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
  ppcVar9 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_finish);
  if (ppcVar9 != (pointer)0x0) {
    std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs,
               &(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
    cmDebugger::cmDebuggerAdapter::OnBeginFileParse
              ((cmDebuggerAdapter *)
               subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
               super__Vector_impl_data._M_start,this,&currentStart);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                super__Vector_impl_data._M_finish);
  }
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  listFile.Functions.super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar4 = cmListFile::ParseFile
                    (&listFile,currentStart._M_dataplus._M_p,
                     (this->GlobalGenerator->CMakeInstance->Messenger)._M_t.
                     super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
                     super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
                     super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl,value);
  if (bVar4) {
    std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs,
               &(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
    ppcVar9 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                super__Vector_impl_data._M_finish);
    if (ppcVar9 != (pointer)0x0) {
      std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs
                 ,&(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                   super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse
                ((cmDebuggerAdapter *)
                 subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
      std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs
                 ,&(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                   super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
      cmDebugger::cmDebuggerAdapter::OnFileParsedSuccessfully
                ((cmDebuggerAdapter *)
                 subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start,&currentStart,&listFile.Functions);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
    bVar4 = IsRootMakefile(this);
    pcVar3 = listFile.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar6 = listFile.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar4) {
      do {
        if (pcVar6 == pcVar3) {
          if (0x1df < (ulong)((long)listFile.Functions.
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                             (long)listFile.Functions.
                                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                   ._M_impl.super__Vector_impl_data._M_start)) goto LAB_00299718;
          subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_finish =
               (pointer)((ulong)subdirs.
                                super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                                _M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
          subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&project,"project",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"set",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"if",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"endif",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"else",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"elseif",&local_231)
          ;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&project,"add_executable",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&project,"add_library",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&project,"target_link_libraries",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>((string *)&project,"option",&local_231)
          ;
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&project,"message",&local_231);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&subdirs,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&project);
          std::__cxx11::string::~string((string *)&project);
          pcVar3 = listFile.Functions.
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          pcVar6 = listFile.Functions.
                   super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          goto LAB_002996f1;
        }
        peVar1 = (pcVar6->Impl).
                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        __y._M_str = "cmake_minimum_required";
        __y._M_len = 0x16;
        __x._M_str = (peVar1->LowerCaseName)._M_dataplus._M_p;
        __x._M_len = (peVar1->LowerCaseName)._M_string_length;
        bVar4 = std::operator==(__x,__y);
        pcVar6 = pcVar6 + 1;
        pcVar7 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_start;
        pcVar2 = listFile.Functions.
                 super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl
                 .super__Vector_impl_data._M_finish;
      } while (!bVar4);
      goto LAB_00299759;
    }
LAB_00299977:
    std::make_unique<cmMakefile::DeferCommands>();
    ppcVar9 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
    ::reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
             *)&this->Defer,(pointer)ppcVar9);
    std::unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>::
    ~unique_ptr((unique_ptr<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
                 *)&subdirs);
    RunListFile(this,&listFile,&currentStart,
                (this->Defer)._M_t.
                super___uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
                ._M_t.
                super__Tuple_impl<0UL,_cmMakefile::DeferCommands_*,_std::default_delete<cmMakefile::DeferCommands>_>
                .super__Head_base<0UL,_cmMakefile::DeferCommands_*,_false>._M_head_impl);
    std::__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
    ::reset((__uniq_ptr_impl<cmMakefile::DeferCommands,_std::default_delete<cmMakefile::DeferCommands>_>
             *)&this->Defer,(pointer)0x0);
    bVar4 = cmSystemTools::GetFatalErrorOccurred();
    if (bVar4) {
      scope.ReportError = false;
    }
    std::vector<cmMakefile_*,_std::allocator<cmMakefile_*>_>::vector
              (&subdirs,&this->UnConfiguredDirectories);
    for (ppcVar9 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        ppcVar9 !=
        subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
        super__Vector_impl_data._M_finish; ppcVar9 = ppcVar9 + 1) {
      cmStateSnapshot::InitializeFromParent_ForSubdirsCommand(&(*ppcVar9)->StateSnapshot);
      ConfigureSubDirectory(this,*ppcVar9);
    }
    AddCMakeDependFilesFromUser(this);
    std::_Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>::~_Vector_base
              (&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>);
  }
  else {
    std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs,
               &(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
    ppcVar9 = subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                super__Vector_impl_data._M_finish);
    if (ppcVar9 != (pointer)0x0) {
      std::__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2> *)&subdirs
                 ,&(this->GlobalGenerator->CMakeInstance->DebugAdapter).
                   super___shared_ptr<cmDebugger::cmDebuggerAdapter,_(__gnu_cxx::_Lock_policy)2>);
      cmDebugger::cmDebuggerAdapter::OnEndFileParse
                ((cmDebuggerAdapter *)
                 subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_start);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
    }
  }
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::~vector(&listFile.Functions)
  ;
  std::__cxx11::string::~string((string *)&filesDir);
  BuildsystemFileScope::~BuildsystemFileScope(&scope);
  std::__cxx11::string::~string((string *)&currentStart);
  return;
  while( true ) {
    bVar4 = ::cm::
            contains<std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&subdirs,
                       &((pcVar6->Impl).
                         super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->LowerCaseName);
    pcVar6 = pcVar6 + 1;
    if (!bVar4) break;
LAB_002996f1:
    if (pcVar6 == pcVar3) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&subdirs);
      pcVar7 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar2 = listFile.Functions.
               super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
               super__Vector_impl_data._M_finish;
      goto LAB_00299759;
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&subdirs);
LAB_00299718:
  this->CheckCMP0000 = true;
  cmPolicies::ApplyPolicyVersion(this,2,4,0,Off);
  pcVar7 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar2 = listFile.Functions.
           super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
           super__Vector_impl_data._M_finish;
LAB_00299759:
  if (pcVar7 != pcVar2) goto code_r0x0029975e;
  this_00 = this->GlobalGenerator->CMakeInstance;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subdirs,
             "No project() command is present.  The top-level CMakeLists.txt file must contain a literal, direct call to the project() command.  Add a line of code such as\n  project(ProjectName)\nnear the top of the file, but after cmake_minimum_required().\nCMake is pretending there is a \"project(Project)\" command on the first line."
             ,(allocator<char> *)&project);
  cmake::IssueMessage(this_00,AUTHOR_WARNING,(string *)&subdirs,value);
  std::__cxx11::string::~string((string *)&subdirs);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"project",&local_231);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"Project",&local_209);
  subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_finish = local_148;
  subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  if (local_150 != (pointer)&local_140) {
    subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
    super__Vector_impl_data._M_start = local_150;
  }
  subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT71(uStack_13f,local_140);
  local_148 = (pointer)0x0;
  local_140 = 0;
  local_150 = (pointer)&local_140;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_170,"__CMAKE_INJECTED_PROJECT_COMMAND__",&local_20a);
  local_170 = local_160;
  local_168 = 0;
  local_160[0] = 0;
  __l._M_len = 2;
  __l._M_array = (iterator)&subdirs;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
            (&local_130,__l,&local_20b);
  cmListFileFunction::cmListFileFunction(&project,&local_118,0,0,&local_130);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_130);
  lVar8 = 0x30;
  do {
    std::__cxx11::string::~string
              ((string *)
               ((long)&subdirs.super__Vector_base<cmMakefile_*,_std::allocator<cmMakefile_*>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar8));
    lVar8 = lVar8 + -0x30;
  } while (lVar8 != -0x30);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string((string *)&local_150);
  std::__cxx11::string::~string((string *)&local_118);
  std::vector<cmListFileFunction,_std::allocator<cmListFileFunction>_>::insert
            (&listFile.Functions,
             (const_iterator)
             listFile.Functions.
             super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
             super__Vector_impl_data._M_start,&project);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&project.Impl.
              super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  goto LAB_00299977;
code_r0x0029975e:
  peVar1 = (pcVar7->Impl).
           super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  __y_00._M_str = "project";
  __y_00._M_len = 7;
  __x_00._M_str = (peVar1->LowerCaseName)._M_dataplus._M_p;
  __x_00._M_len = (peVar1->LowerCaseName)._M_string_length;
  bVar4 = std::operator==(__x_00,__y_00);
  pcVar7 = pcVar7 + 1;
  if (bVar4) goto LAB_00299977;
  goto LAB_00299759;
}

Assistant:

void cmMakefile::Configure()
{
  std::string currentStart = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentSource(), "/CMakeLists.txt");

  // Add the bottom of all backtraces within this directory.
  // We will never pop this scope because it should be available
  // for messages during the generate step too.
  this->Backtrace =
    this->Backtrace.Push(cmListFileContext::FromListFilePath(currentStart));

  BuildsystemFileScope scope(this);

  // make sure the CMakeFiles dir is there
  std::string filesDir = cmStrCat(
    this->StateSnapshot.GetDirectory().GetCurrentBinary(), "/CMakeFiles");
  cmSystemTools::MakeDirectory(filesDir);

  assert(cmSystemTools::FileExists(currentStart, true));
  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentStart);

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnBeginFileParse(
      this, currentStart);
  }
#endif

  cmListFile listFile;
  if (!listFile.ParseFile(currentStart.c_str(), this->GetMessenger(),
                          this->Backtrace)) {
#ifdef CMake_ENABLE_DEBUGGER
    if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
      this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    }
#endif

    return;
  }

#ifdef CMake_ENABLE_DEBUGGER
  if (this->GetCMakeInstance()->GetDebugAdapter() != nullptr) {
    this->GetCMakeInstance()->GetDebugAdapter()->OnEndFileParse();
    this->GetCMakeInstance()->GetDebugAdapter()->OnFileParsedSuccessfully(
      currentStart, listFile.Functions);
  }
#endif

  if (this->IsRootMakefile()) {
    bool hasVersion = false;
    // search for the right policy command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "cmake_minimum_required"_s) {
        hasVersion = true;
        break;
      }
    }
    // if no policy command is found this is an error if they use any
    // non advanced functions or a lot of functions
    if (!hasVersion) {
      bool isProblem = true;
      if (listFile.Functions.size() < 30) {
        // the list of simple commands DO NOT ADD TO THIS LIST!!!!!
        // these commands must have backwards compatibility forever and
        // and that is a lot longer than your tiny mind can comprehend mortal
        std::set<std::string> allowedCommands;
        allowedCommands.insert("project");
        allowedCommands.insert("set");
        allowedCommands.insert("if");
        allowedCommands.insert("endif");
        allowedCommands.insert("else");
        allowedCommands.insert("elseif");
        allowedCommands.insert("add_executable");
        allowedCommands.insert("add_library");
        allowedCommands.insert("target_link_libraries");
        allowedCommands.insert("option");
        allowedCommands.insert("message");
        isProblem = false;
        for (cmListFileFunction const& func : listFile.Functions) {
          if (!cm::contains(allowedCommands, func.LowerCaseName())) {
            isProblem = true;
            break;
          }
        }
      }

      if (isProblem) {
        // Tell the top level cmMakefile to diagnose
        // this violation of CMP0000.
        this->SetCheckCMP0000(true);

        // Implicitly set the version for the user.
        cmPolicies::ApplyPolicyVersion(this, 2, 4, 0,
                                       cmPolicies::WarnCompat::Off);
      }
    }
    bool hasProject = false;
    // search for a project command
    for (cmListFileFunction const& func : listFile.Functions) {
      if (func.LowerCaseName() == "project"_s) {
        hasProject = true;
        break;
      }
    }
    // if no project command is found, add one
    if (!hasProject) {
      this->GetCMakeInstance()->IssueMessage(
        MessageType::AUTHOR_WARNING,
        "No project() command is present.  The top-level CMakeLists.txt "
        "file must contain a literal, direct call to the project() command.  "
        "Add a line of code such as\n"
        "  project(ProjectName)\n"
        "near the top of the file, but after cmake_minimum_required().\n"
        "CMake is pretending there is a \"project(Project)\" command on "
        "the first line.",
        this->Backtrace);
      cmListFileFunction project{ "project",
                                  0,
                                  0,
                                  { { "Project", cmListFileArgument::Unquoted,
                                      0 },
                                    { "__CMAKE_INJECTED_PROJECT_COMMAND__",
                                      cmListFileArgument::Unquoted, 0 } } };
      listFile.Functions.insert(listFile.Functions.begin(), project);
    }
  }

  this->Defer = cm::make_unique<DeferCommands>();
  this->RunListFile(listFile, currentStart, this->Defer.get());
  this->Defer.reset();
  if (cmSystemTools::GetFatalErrorOccurred()) {
    scope.Quiet();
  }

  // at the end handle any old style subdirs
  std::vector<cmMakefile*> subdirs = this->UnConfiguredDirectories;

  // for each subdir recurse
  auto sdi = subdirs.begin();
  for (; sdi != subdirs.end(); ++sdi) {
    (*sdi)->StateSnapshot.InitializeFromParent_ForSubdirsCommand();
    this->ConfigureSubDirectory(*sdi);
  }

  this->AddCMakeDependFilesFromUser();
}